

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O0

uint256 * jbcoin::getQualityNext(uint256 *__return_storage_ptr__,uint256 *uBase)

{
  int iVar1;
  char *text;
  uint256 *uBase_local;
  
  if (getQualityNext(jbcoin::base_uint<256ul,void>const&)::uNext == '\0') {
    iVar1 = __cxa_guard_acquire(&getQualityNext(jbcoin::base_uint<256ul,void>const&)::uNext);
    if (iVar1 != 0) {
      from_hex_text<jbcoin::base_uint<256ul,void>>
                (&getQualityNext::uNext,(jbcoin *)"10000000000000000",text);
      __cxa_guard_release(&getQualityNext(jbcoin::base_uint<256ul,void>const&)::uNext);
    }
  }
  operator+(__return_storage_ptr__,uBase,&getQualityNext::uNext);
  return __return_storage_ptr__;
}

Assistant:

uint256
getQualityNext (uint256 const& uBase)
{
    static uint256 const uNext (
        from_hex_text<uint256>("10000000000000000"));
    return uBase + uNext;
}